

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O2

NamesAndLabels * __thiscall
DebugUtilsData::PopulateNamesAndLabels
          (NamesAndLabels *__return_storage_ptr__,DebugUtilsData *this,
          vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *objects)

{
  pointer pXVar1;
  XrSdkLogObjectInfo *obj;
  pointer info;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *__range1;
  vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> labels;
  _Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> local_78;
  _Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> local_60;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_48;
  
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pXVar1 = (objects->super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (info = (objects->super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>)
              ._M_impl.super__Vector_impl_data._M_start; info != pXVar1; info = info + 1) {
    ObjectInfoCollection::LookUpObjectName(&this->object_info_,info);
    if (info->type == XR_OBJECT_TYPE_SESSION) {
      LookUpSessionLabels(this,(XrSession)info->handle,
                          (vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> *)
                          &local_78);
    }
  }
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_48,objects);
  std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::vector
            ((vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> *)&local_60,
             (vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> *)&local_78);
  NamesAndLabels::NamesAndLabels
            (__return_storage_ptr__,&local_48,
             (vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> *)&local_60);
  std::_Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::~_Vector_base
            (&local_60);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_48);
  std::_Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::~_Vector_base
            (&local_78);
  return __return_storage_ptr__;
}

Assistant:

NamesAndLabels DebugUtilsData::PopulateNamesAndLabels(std::vector<XrSdkLogObjectInfo> objects) const {
    std::vector<XrDebugUtilsLabelEXT> labels;
    for (auto& obj : objects) {
        // Check for any names that have been associated with the objects and set them up here
        object_info_.LookUpObjectName(obj);
        // If this is a session, see if there are any labels associated with it for us to add
        // to the callback content.
        if (XR_OBJECT_TYPE_SESSION == obj.type) {
            LookUpSessionLabels(obj.GetTypedHandle<XrSession>(), labels);
        }
    }

    return {objects, labels};
}